

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fms.c
# Opt level: O0

FmsInt CompareIntData(FmsIntType itype,FmsInt size,void *lhs,void *rhs)

{
  long in_RCX;
  long in_RDX;
  ulong in_RSI;
  undefined4 in_EDI;
  uint8_t *lhs_data_4;
  FmsInt i_3;
  FmsInt N_3;
  int64_t *rhs_data_3;
  int64_t *lhs_data_3;
  FmsInt i_2;
  FmsInt N_2;
  int32_t *rhs_data_2;
  int32_t *lhs_data_2;
  FmsInt i_1;
  FmsInt N_1;
  int16_t *rhs_data_1;
  int16_t *lhs_data_1;
  FmsInt i;
  FmsInt N;
  int8_t *rhs_data;
  int8_t *lhs_data;
  FmsInt isDifferent;
  ulong local_130;
  ulong local_110;
  ulong local_f0;
  ulong local_d0;
  ulong local_b0;
  ulong local_90;
  FmsInt i_7;
  FmsInt N_7;
  uint64_t *rhs_data_7;
  uint64_t *lhs_data_7;
  FmsInt i_6;
  FmsInt N_6;
  uint32_t *rhs_data_6;
  uint32_t *lhs_data_6;
  FmsInt i_5;
  FmsInt N_5;
  uint16_t *rhs_data_5;
  uint16_t *lhs_data_5;
  FmsInt i_4;
  FmsInt N_4;
  uint8_t *rhs_data_4;
  
  if (in_RDX == in_RCX) {
    rhs_data_4 = (uint8_t *)0x0;
  }
  else if (in_RDX == 0) {
    rhs_data_4 = (uint8_t *)0x1;
  }
  else if (in_RCX == 0) {
    rhs_data_4 = (uint8_t *)0x1;
  }
  else {
    switch(in_EDI) {
    case 0:
      N_5 = 0;
      for (N_6 = 0; N_6 < in_RSI; N_6 = N_6 + 1) {
        if (*(char *)(in_RDX + N_6) != *(char *)(in_RCX + N_6)) {
          N_5 = N_6 + 1;
          break;
        }
      }
      break;
    case 1:
      N_5 = 0;
      for (N_7 = 0; N_7 < in_RSI; N_7 = N_7 + 1) {
        if (*(short *)(in_RDX + N_7 * 2) != *(short *)(in_RCX + N_7 * 2)) {
          N_5 = N_7 + 1;
          break;
        }
      }
      break;
    case 2:
      N_5 = 0;
      for (local_90 = 0; local_90 < in_RSI; local_90 = local_90 + 1) {
        if (*(int *)(in_RDX + local_90 * 4) != *(int *)(in_RCX + local_90 * 4)) {
          N_5 = local_90 + 1;
          break;
        }
      }
      break;
    case 3:
      N_5 = 0;
      for (local_b0 = 0; local_b0 < in_RSI; local_b0 = local_b0 + 1) {
        if (*(long *)(in_RDX + local_b0 * 8) != *(long *)(in_RCX + local_b0 * 8)) {
          N_5 = local_b0 + 1;
          break;
        }
      }
      break;
    case 4:
      N_5 = 0;
      for (local_d0 = 0; local_d0 < in_RSI; local_d0 = local_d0 + 1) {
        if (*(char *)(in_RDX + local_d0) != *(char *)(in_RCX + local_d0)) {
          N_5 = local_d0 + 1;
          break;
        }
      }
      break;
    case 5:
      N_5 = 0;
      for (local_f0 = 0; local_f0 < in_RSI; local_f0 = local_f0 + 1) {
        if (*(short *)(in_RDX + local_f0 * 2) != *(short *)(in_RCX + local_f0 * 2)) {
          N_5 = local_f0 + 1;
          break;
        }
      }
      break;
    case 6:
      N_5 = 0;
      for (local_110 = 0; local_110 < in_RSI; local_110 = local_110 + 1) {
        if (*(int *)(in_RDX + local_110 * 4) != *(int *)(in_RCX + local_110 * 4)) {
          N_5 = local_110 + 1;
          break;
        }
      }
      break;
    case 7:
      N_5 = 0;
      for (local_130 = 0; local_130 < in_RSI; local_130 = local_130 + 1) {
        if (*(long *)(in_RDX + local_130 * 8) != *(long *)(in_RCX + local_130 * 8)) {
          N_5 = local_130 + 1;
          break;
        }
      }
      break;
    default:
      return 2;
    }
    rhs_data_4 = (uint8_t *)N_5;
  }
  return (FmsInt)rhs_data_4;
}

Assistant:

static inline FmsInt CompareIntData(FmsIntType itype, FmsInt size,
                                    const void *lhs, const void *rhs) {
  if(lhs == rhs) return 0;
  if(!lhs) return 1;
  if(!rhs) return 1;
  FmsInt isDifferent = 0;
  switch(itype) {
  case FMS_INT8:
    COMPARE_INT_DATA(int8_t, lhs, rhs, size, isDifferent);
    break;
  case FMS_INT16:
    COMPARE_INT_DATA(int16_t, lhs, rhs, size, isDifferent);
    break;
  case FMS_INT32:
    COMPARE_INT_DATA(int32_t, lhs, rhs, size, isDifferent);
    break;
  case FMS_INT64:
    COMPARE_INT_DATA(int64_t, lhs, rhs, size, isDifferent);
    break;
  case FMS_UINT8:
    COMPARE_INT_DATA(uint8_t, lhs, rhs, size, isDifferent);
    break;
  case FMS_UINT16:
    COMPARE_INT_DATA(uint16_t, lhs, rhs, size, isDifferent);
    break;
  case FMS_UINT32:
    COMPARE_INT_DATA(uint32_t, lhs, rhs, size, isDifferent);
    break;
  case FMS_UINT64:
    COMPARE_INT_DATA(uint64_t, lhs, rhs, size, isDifferent);
    break;
  default:
    return 2;
  }
  return isDifferent;
}